

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O1

void ncnn::resize_bilinear_c2
               (uchar *src,int srcw,int srch,int srcstride,uchar *dst,int w,int h,int stride)

{
  long lVar1;
  size_t __size;
  long lVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  float fVar6;
  int iVar7;
  void *pvVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  short *psVar12;
  void *pvVar13;
  void *pvVar14;
  int iVar15;
  ulong uVar16;
  void *pvVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  size_t totalsize;
  bool bVar21;
  uint uVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  void *ptr;
  void *local_b0;
  void *local_80;
  void *local_70;
  ulong local_68;
  ulong local_60;
  int *local_58;
  int *local_50;
  long local_48;
  uchar *local_40;
  void *local_38;
  
  uVar11 = (ulong)(uint)w;
  iVar7 = (h + w) * 2;
  uVar19 = 0xffffffffffffffff;
  if (-1 < iVar7) {
    uVar19 = (long)iVar7 * 4;
  }
  local_40 = src;
  pvVar8 = operator_new__(uVar19);
  lVar9 = (long)w;
  pvVar13 = (void *)((long)pvVar8 + lVar9 * 4);
  local_48 = (long)h;
  lVar1 = local_48 * 4;
  local_68 = uVar11;
  local_60 = uVar11;
  local_38 = pvVar13;
  if (0 < w) {
    lVar2 = local_48 * 4;
    uVar11 = 0;
    do {
      fVar6 = ((float)(int)uVar11 + 0.5) * (float)srcw * (1.0 / (float)w) + -0.5;
      fVar23 = floorf(fVar6);
      iVar7 = (int)fVar23;
      fVar26 = 0.0;
      bVar21 = -1 < iVar7;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      if (bVar21) {
        fVar26 = (fVar6 - (float)(int)fVar23) * 2048.0;
      }
      if (srcw + -1 <= iVar7) {
        fVar26 = 2048.0;
        iVar7 = srcw + -2;
      }
      *(int *)((long)pvVar8 + uVar11 * 4) = iVar7 * 2;
      uVar22 = -(uint)(0.0 <= 2048.0 - fVar26);
      auVar24._0_4_ = (int)((float)(uVar22 & 0x3f000000 | ~uVar22 & 0xbf000000) + (2048.0 - fVar26))
      ;
      auVar24._4_4_ =
           (int)((float)(-(uint)(0.0 <= fVar26) & 0x3f000000 | ~-(uint)(0.0 <= fVar26) & 0xbf000000)
                + fVar26);
      auVar24._8_8_ = 0;
      auVar24 = packssdw(auVar24,auVar24);
      *(int *)((long)pvVar8 + uVar11 * 4 + lVar2 + lVar9 * 4) = auVar24._0_4_;
      uVar11 = uVar11 + 1;
    } while (local_60 != uVar11);
  }
  psVar12 = (short *)((long)pvVar13 + lVar9 * 4 + lVar1);
  if (0 < h) {
    uVar11 = 0;
    do {
      fVar6 = ((float)(int)uVar11 + 0.5) * (float)srch * (1.0 / (float)h) + -0.5;
      fVar23 = floorf(fVar6);
      iVar7 = (int)fVar23;
      fVar26 = 0.0;
      bVar21 = -1 < iVar7;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      if (bVar21) {
        fVar26 = (fVar6 - (float)(int)fVar23) * 2048.0;
      }
      iVar10 = iVar7;
      if (srch + -1 <= iVar7) {
        iVar10 = srch + -2;
      }
      *(int *)((long)local_38 + uVar11 * 4) = iVar10;
      if (srch + -1 <= iVar7) {
        fVar26 = 2048.0;
      }
      uVar22 = -(uint)(0.0 <= 2048.0 - fVar26);
      auVar25._0_4_ = (int)((float)(uVar22 & 0x3f000000 | ~uVar22 & 0xbf000000) + (2048.0 - fVar26))
      ;
      auVar25._4_4_ =
           (int)((float)(-(uint)(0.0 <= fVar26) & 0x3f000000 | ~-(uint)(0.0 <= fVar26) & 0xbf000000)
                + fVar26);
      auVar25._8_8_ = 0;
      auVar24 = packssdw(auVar25,auVar25);
      *(int *)(psVar12 + uVar11 * 2) = auVar24._0_4_;
      uVar11 = uVar11 + 1;
    } while ((uint)h != uVar11);
  }
  uVar11 = local_68;
  iVar10 = (int)local_68 * 2;
  iVar7 = iVar10 + 2;
  if (iVar7 == 0) {
    local_50 = (int *)0x0;
    local_b0 = (void *)0x0;
    local_58 = (int *)0x0;
    local_80 = (void *)0x0;
  }
  else {
    __size = (long)iVar7 * 2 + 4;
    lVar1 = (long)iVar7 * 2;
    local_70 = (void *)0x0;
    iVar7 = posix_memalign(&local_70,0x10,__size);
    if (iVar7 != 0) {
      local_70 = (void *)0x0;
    }
    pvVar13 = local_70;
    local_b0 = local_70;
    *(undefined4 *)((long)local_70 + lVar1) = 1;
    local_70 = (void *)0x0;
    iVar7 = posix_memalign(&local_70,0x10,__size);
    if (iVar7 != 0) {
      local_70 = (void *)0x0;
    }
    local_50 = (int *)((long)pvVar13 + lVar1);
    local_58 = (int *)((long)local_70 + lVar1);
    local_80 = local_70;
    *(undefined4 *)((long)local_70 + lVar1) = 1;
  }
  if (0 < h) {
    lVar1 = local_48 * 4 + lVar9 * 4;
    uVar19 = 0;
    pvVar13 = local_b0;
    pvVar17 = local_80;
    iVar7 = -2;
    do {
      iVar5 = *(int *)((long)local_38 + uVar19 * 4);
      pvVar14 = pvVar13;
      if (iVar5 != iVar7) {
        if (iVar5 == iVar7 + 1) {
          pvVar14 = pvVar17;
          pvVar17 = pvVar13;
          if (0 < (int)uVar11) {
            iVar7 = (iVar5 + 1) * srcstride;
            uVar16 = 0;
            do {
              lVar9 = (long)*(int *)((long)pvVar8 + uVar16 * 4);
              iVar18 = (int)*(short *)((long)pvVar8 + uVar16 * 4 + lVar1);
              iVar20 = (int)*(short *)((long)pvVar8 + uVar16 * 4 + lVar1 + 2);
              *(short *)((long)pvVar13 + uVar16 * 4) =
                   (short)((uint)local_40[lVar9 + (long)iVar7 + 2] * iVar20 +
                           (uint)local_40[lVar9 + iVar7] * iVar18 >> 4);
              *(short *)((long)pvVar13 + uVar16 * 4 + 2) =
                   (short)((uint)local_40[lVar9 + (long)iVar7 + 3] * iVar20 +
                           (uint)local_40[lVar9 + (long)iVar7 + 1] * iVar18 >> 4);
              uVar16 = uVar16 + 1;
              uVar11 = local_68;
            } while (local_60 != uVar16);
          }
        }
        else if (0 < (int)uVar11) {
          iVar7 = iVar5 * srcstride;
          iVar18 = (iVar5 + 1) * srcstride;
          uVar16 = 0;
          do {
            lVar9 = (long)*(int *)((long)pvVar8 + uVar16 * 4);
            iVar15 = (int)*(short *)((long)pvVar8 + uVar16 * 4 + lVar1);
            iVar20 = (int)*(short *)((long)pvVar8 + uVar16 * 4 + lVar1 + 2);
            *(short *)((long)pvVar13 + uVar16 * 4) =
                 (short)((uint)local_40[lVar9 + (long)iVar7 + 2] * iVar20 +
                         (uint)local_40[lVar9 + iVar7] * iVar15 >> 4);
            *(short *)((long)pvVar13 + uVar16 * 4 + 2) =
                 (short)((uint)local_40[lVar9 + (long)iVar7 + 3] * iVar20 +
                         (uint)local_40[lVar9 + (long)iVar7 + 1] * iVar15 >> 4);
            *(short *)((long)pvVar17 + uVar16 * 4) =
                 (short)((uint)local_40[lVar9 + (long)iVar18 + 2] * iVar20 +
                         (uint)local_40[lVar9 + iVar18] * iVar15 >> 4);
            *(short *)((long)pvVar17 + uVar16 * 4 + 2) =
                 (short)((uint)local_40[lVar9 + (long)iVar18 + 3] * iVar20 +
                         (uint)local_40[lVar9 + (long)iVar18 + 1] * iVar15 >> 4);
            uVar16 = uVar16 + 1;
            uVar11 = local_68;
          } while (local_60 != uVar16);
        }
      }
      if ((int)uVar11 != 0) {
        sVar3 = psVar12[1];
        sVar4 = *psVar12;
        lVar9 = 0;
        do {
          dst[lVar9] = (uchar)(((uint)((int)*(short *)((long)pvVar14 + lVar9 * 2) * (int)sVar4) >>
                               0x10) + ((uint)((int)*(short *)((long)pvVar17 + lVar9 * 2) *
                                              (int)sVar3) >> 0x10) + 2 >> 2);
          lVar9 = lVar9 + 1;
        } while (iVar10 != (int)lVar9);
      }
      psVar12 = psVar12 + 2;
      uVar19 = uVar19 + 1;
      dst = dst + stride;
      pvVar13 = pvVar14;
      iVar7 = iVar5;
    } while (uVar19 != (uint)h);
  }
  operator_delete__(pvVar8);
  if (local_58 != (int *)0x0) {
    LOCK();
    iVar7 = *local_58;
    *local_58 = *local_58 + -1;
    UNLOCK();
    if ((local_80 != (void *)0x0) && (iVar7 == 1)) {
      free(local_80);
    }
  }
  if (local_50 != (int *)0x0) {
    LOCK();
    *local_50 = *local_50 + -1;
    UNLOCK();
    if (local_b0 != (void *)0x0 && *local_50 == 0) {
      free(local_b0);
    }
  }
  return;
}

Assistant:

void resize_bilinear_c2(const unsigned char* src, int srcw, int srch, int srcstride, unsigned char* dst, int w, int h, int stride)
{
    const int INTER_RESIZE_COEF_BITS=11;
    const int INTER_RESIZE_COEF_SCALE=1 << INTER_RESIZE_COEF_BITS;
//     const int ONE=INTER_RESIZE_COEF_SCALE;

    double scale_x = (double)srcw / w;
    double scale_y = (double)srch / h;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;//new int[w];
    int* yofs = buf + w;//new int[h];

    short* ialpha = (short*)(buf + w + h);//new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w);//new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = floor(fx);
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= srcw - 1)
        {
            sx = srcw - 2;
            fx = 1.f;
        }

        xofs[dx] = sx*2;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 =        fx  * INTER_RESIZE_COEF_SCALE;

        ialpha[dx*2    ] = SATURATE_CAST_SHORT(a0);
        ialpha[dx*2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = floor(fy);
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= srch - 1)
        {
            sy = srch - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 =        fy  * INTER_RESIZE_COEF_SCALE;

        ibeta[dy*2    ] = SATURATE_CAST_SHORT(b0);
        ibeta[dy*2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w*2+2, (size_t)2u);
    Mat rowsbuf1(w*2+2, (size_t)2u);
    short* rows0 = (short*)rowsbuf0.data;
    short* rows1 = (short*)rowsbuf1.data;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++ )
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char *S1 = src + srcstride * (sy+1);

            const short* ialphap = ialpha;
            short* rows1p = rows1;
            for ( int dx = 0; dx < w; dx++ )
            {
                int sx = xofs[dx];

                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0a1XX = vld1_s16(ialphap);
                int16x4_t _a0a0a1a1 = vzip_s16(_a0a1XX, _a0a1XX).val[0];
                uint8x8_t _S1 = uint8x8_t();

                _S1 = vld1_lane_u8(S1p, _S1, 0);
                _S1 = vld1_lane_u8(S1p+1, _S1, 1);
                _S1 = vld1_lane_u8(S1p+2, _S1, 2);
                _S1 = vld1_lane_u8(S1p+3, _S1, 3);

                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S1lowhigh = vget_low_s16(_S116);
                int32x4_t _S1ma0a1 = vmull_s16(_S1lowhigh, _a0a0a1a1);
                int32x2_t _rows1low = vadd_s32(vget_low_s32(_S1ma0a1), vget_high_s32(_S1ma0a1));
                int32x4_t _rows1 = vcombine_s32(_rows1low, vget_high_s32(_S1ma0a1));
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                rows1p[0] = (S1p[0]*a0 + S1p[2]*a1) >> 4;
                rows1p[1] = (S1p[1]*a0 + S1p[3]*a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows1p += 2;
            }
        }
        else
        {
            // hresize two rows
            const unsigned char *S0 = src + srcstride * (sy);
            const unsigned char *S1 = src + srcstride * (sy+1);

            const short* ialphap = ialpha;
            short* rows0p = rows0;
            short* rows1p = rows1;
            for ( int dx = 0; dx < w; dx++ )
            {
                int sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S0p = S0 + sx;
                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S0 = uint8x8_t();
                uint8x8_t _S1 = uint8x8_t();

                _S0 = vld1_lane_u8(S0p, _S0, 0);
                _S0 = vld1_lane_u8(S0p+1, _S0, 1);
                _S0 = vld1_lane_u8(S0p+2, _S0, 2);
                _S0 = vld1_lane_u8(S0p+3, _S0, 3);

                _S1 = vld1_lane_u8(S1p, _S1, 0);
                _S1 = vld1_lane_u8(S1p+1, _S1, 1);
                _S1 = vld1_lane_u8(S1p+2, _S1, 2);
                _S1 = vld1_lane_u8(S1p+3, _S1, 3);

                int16x8_t _S016 = vreinterpretq_s16_u16(vmovl_u8(_S0));
                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S0lowhigh = vget_low_s16(_S016);
                int16x4_t _S1lowhigh = vget_low_s16(_S116);
                int32x2x2_t _S0S1low_S0S1high = vtrn_s32(vreinterpret_s32_s16(_S0lowhigh), vreinterpret_s32_s16(_S1lowhigh));
                int32x4_t _rows01 = vmull_s16(vreinterpret_s16_s32(_S0S1low_S0S1high.val[0]), _a0);
                _rows01 = vmlal_s16(_rows01, vreinterpret_s16_s32(_S0S1low_S0S1high.val[1]), _a1);
                int16x4_t _rows01_sr4 = vshrn_n_s32(_rows01, 4);
                int16x4_t _rows1_sr4 = vext_s16(_rows01_sr4, _rows01_sr4, 2);
                vst1_s16(rows0p, _rows01_sr4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows0p[0] = (S0p[0]*a0 + S0p[2]*a1) >> 4;
                rows0p[1] = (S0p[1]*a0 + S0p[3]*a1) >> 4;
                rows1p[0] = (S1p[0]*a0 + S1p[2]*a1) >> 4;
                rows1p[1] = (S1p[1]*a0 + S1p[3]*a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows0p += 2;
                rows1p += 2;
            }
        }

        prev_sy1 = sy;

        // vresize
        short b0 = ibeta[0];
        short b1 = ibeta[1];

        short* rows0p = rows0;
        short* rows1p = rows1;
        unsigned char* Dp = dst + stride * (dy);

#if __ARM_NEON
        int nn = (w * 2) >> 3;
#else
        int nn = 0;
#endif
        int remain = (w * 2) - (nn << 3);

#if __ARM_NEON
#if __aarch64__
        int16x4_t _b0 = vdup_n_s16(b0);
        int16x4_t _b1 = vdup_n_s16(b1);
        int32x4_t _v2 = vdupq_n_s32(2);
        for (; nn>0; nn--)
        {
            int16x4_t _rows0p_sr4 = vld1_s16(rows0p);
            int16x4_t _rows1p_sr4 = vld1_s16(rows1p);
            int16x4_t _rows0p_1_sr4 = vld1_s16(rows0p+4);
            int16x4_t _rows1p_1_sr4 = vld1_s16(rows1p+4);

            int32x4_t _rows0p_sr4_mb0 = vmull_s16(_rows0p_sr4, _b0);
            int32x4_t _rows1p_sr4_mb1 = vmull_s16(_rows1p_sr4, _b1);
            int32x4_t _rows0p_1_sr4_mb0 = vmull_s16(_rows0p_1_sr4, _b0);
            int32x4_t _rows1p_1_sr4_mb1 = vmull_s16(_rows1p_1_sr4, _b1);

            int32x4_t _acc = _v2;
            _acc = vsraq_n_s32(_acc, _rows0p_sr4_mb0, 16);
            _acc = vsraq_n_s32(_acc, _rows1p_sr4_mb1, 16);

            int32x4_t _acc_1 = _v2;
            _acc_1 = vsraq_n_s32(_acc_1, _rows0p_1_sr4_mb0, 16);
            _acc_1 = vsraq_n_s32(_acc_1, _rows1p_1_sr4_mb1, 16);

            int16x4_t _acc16 = vshrn_n_s32(_acc, 2);
            int16x4_t _acc16_1 = vshrn_n_s32(_acc_1, 2);

            uint8x8_t _D = vqmovun_s16(vcombine_s16(_acc16, _acc16_1));

            vst1_u8(Dp, _D);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
        }
#else
        if (nn > 0)
        {
        asm volatile(
            "vdup.s16   d16, %8         \n"
            "mov        r4, #2          \n"
            "vdup.s16   d17, %9         \n"
            "vdup.s32   q12, r4         \n"
            "pld        [%0, #128]      \n"
            "vld1.s16   {d2-d3}, [%0 :128]!\n"
            "pld        [%1, #128]      \n"
            "vld1.s16   {d6-d7}, [%1 :128]!\n"
            "0:                         \n"
            "vmull.s16  q0, d2, d16     \n"
            "vmull.s16  q1, d3, d16     \n"
            "vorr.s32   q10, q12, q12   \n"
            "vorr.s32   q11, q12, q12   \n"
            "vmull.s16  q2, d6, d17     \n"
            "vmull.s16  q3, d7, d17     \n"
            "vsra.s32   q10, q0, #16    \n"
            "vsra.s32   q11, q1, #16    \n"
            "pld        [%0, #128]      \n"
            "vld1.s16   {d2-d3}, [%0 :128]!\n"
            "vsra.s32   q10, q2, #16    \n"
            "vsra.s32   q11, q3, #16    \n"
            "pld        [%1, #128]      \n"
            "vld1.s16   {d6-d7}, [%1 :128]!\n"
            "vshrn.s32  d20, q10, #2    \n"
            "vshrn.s32  d21, q11, #2    \n"
            "vqmovun.s16 d20, q10        \n"
            "vst1.8     {d20}, [%2]!    \n"
            "subs       %3, #1          \n"
            "bne        0b              \n"
            "sub        %0, #16         \n"
            "sub        %1, #16         \n"
            : "=r"(rows0p), // %0
              "=r"(rows1p), // %1
              "=r"(Dp),     // %2
              "=r"(nn)      // %3
            : "0"(rows0p),
              "1"(rows1p),
              "2"(Dp),
              "3"(nn),
              "r"(b0),      // %8
              "r"(b1)       // %9
            : "cc", "memory", "r4", "q0", "q1", "q2", "q3", "q8", "q9", "q10", "q11", "q12"
        );
        }
#endif // __aarch64__
#endif // __ARM_NEON
        for ( ; remain; --remain )
        {
//             D[x] = (rows0[x]*b0 + rows1[x]*b1) >> INTER_RESIZE_COEF_BITS;
            *Dp++ = (unsigned char)(( (short)((b0 * (short)(*rows0p++)) >> 16) + (short)((b1 * (short)(*rows1p++)) >> 16) + 2)>>2);
        }

        ibeta += 2;
    }

    delete[] buf;
}